

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSavepoint(Btree *p,int op,int iSavepoint)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  BtShared *pBt;
  Pager *in_stack_00000010;
  int rc;
  BtCursor *in_stack_ffffffffffffffd8;
  BtShared *pBt_00;
  uint in_stack_ffffffffffffffe8;
  int iVar1;
  
  iVar1 = 0;
  if ((in_RDI != 0) && (*(char *)(in_RDI + 0x10) == '\x02')) {
    pBt_00 = *(BtShared **)(in_RDI + 8);
    sqlite3BtreeEnter((Btree *)0x172a1f);
    if (in_ESI == 2) {
      iVar1 = saveAllCursors((BtShared *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),
                             (Pgno)((ulong)pBt_00 >> 0x20),in_stack_ffffffffffffffd8);
    }
    if (iVar1 == 0) {
      iVar1 = sqlite3PagerSavepoint(in_stack_00000010,pBt._4_4_,(int)pBt);
    }
    if (iVar1 == 0) {
      if ((in_EDX < 0) && ((pBt_00->btsFlags & 0x10) != 0)) {
        pBt_00->nPage = 0;
      }
      iVar1 = newDatabase((BtShared *)(ulong)in_stack_ffffffffffffffe8);
      btreeSetNPage(pBt_00,(MemPage *)in_stack_ffffffffffffffd8);
    }
    sqlite3BtreeLeave((Btree *)0x172ab0);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSavepoint(Btree *p, int op, int iSavepoint){
  int rc = SQLITE_OK;
  if( p && p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
    assert( iSavepoint>=0 || (iSavepoint==-1 && op==SAVEPOINT_ROLLBACK) );
    sqlite3BtreeEnter(p);
    if( op==SAVEPOINT_ROLLBACK ){
      rc = saveAllCursors(pBt, 0, 0);
    }
    if( rc==SQLITE_OK ){
      rc = sqlite3PagerSavepoint(pBt->pPager, op, iSavepoint);
    }
    if( rc==SQLITE_OK ){
      if( iSavepoint<0 && (pBt->btsFlags & BTS_INITIALLY_EMPTY)!=0 ){
        pBt->nPage = 0;
      }
      rc = newDatabase(pBt);
      btreeSetNPage(pBt, pBt->pPage1);

      /* pBt->nPage might be zero if the database was corrupt when
      ** the transaction was started. Otherwise, it must be at least 1.  */
      assert( CORRUPT_DB || pBt->nPage>0 );
    }
    sqlite3BtreeLeave(p);
  }
  return rc;
}